

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int fd;
  int opt;
  char **argv_local;
  int argc_local;
  
  while (iVar1 = getopt(argc,argv,"fF:hnsc"), iVar1 != -1) {
    switch(iVar1) {
    case 0x46:
      formatted_output = atoi(_optarg);
      break;
    default:
      usage(*argv,1,"Unknown arguments");
    case 99:
      color = 0x20;
      break;
    case 0x66:
      formatted_output = 2;
      break;
    case 0x68:
      usage(*argv,0,(char *)0x0);
    case 0x6e:
      show_output = 0;
      break;
    case 0x73:
      strict_mode = 1;
    }
  }
  if (_optind < argc) {
    fname = argv[_optind];
    iVar1 = open(argv[_optind],0);
    showmem();
    iVar1 = parseit(iVar1,showobj);
    if (iVar1 != 0) {
      exit(1);
    }
    showmem();
    exit(0);
  }
  usage(*argv,1,"Expected argument after options");
}

Assistant:

int main(int argc, char **argv)
{
	int opt;

	while ((opt = getopt(argc, argv, "fF:hnsc")) != -1)
	{
		switch (opt)
		{
		case 'f': formatted_output = JSON_C_TO_STRING_PRETTY; break;
		case 'F': formatted_output = atoi(optarg); break;
		case 'n': show_output = 0; break;
		case 's': strict_mode = 1; break;
		case 'c': color = JSON_C_TO_STRING_COLOR; break;
		case 'h': usage(argv[0], 0, NULL);
		default: /* '?' */ usage(argv[0], EXIT_FAILURE, "Unknown arguments");
		}
	}
	if (optind >= argc)
	{
		usage(argv[0], EXIT_FAILURE, "Expected argument after options");
	}
	fname = argv[optind];

	int fd = open(argv[optind], O_RDONLY, 0);
	showmem();
	if (parseit(fd, showobj) != 0)
		exit(EXIT_FAILURE);
	showmem();

	exit(EXIT_SUCCESS);
}